

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O0

void __thiscall
TorController::get_socks_cb(TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  string_view str;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  reference this_00;
  reference pvVar5;
  size_type sVar6;
  reference pcVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  Proxy *in_RDX;
  long in_FS_OFFSET;
  bool onion_allowed_by_onlynet;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *portstr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  onlynets;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_list;
  const_iterator __end2;
  const_iterator __begin2;
  Proxy addrOnion;
  CService resolved;
  string port_list_str;
  string socks_location;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  char *in_stack_fffffffffffffbc0;
  Proxy *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  char in_stack_fffffffffffffbd7;
  Network in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  ArgsManager *in_stack_fffffffffffffbe0;
  undefined5 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbed;
  undefined1 in_stack_fffffffffffffbee;
  byte bVar10;
  undefined1 in_stack_fffffffffffffbef;
  CService *in_stack_fffffffffffffbf0;
  ReachableNets *this_01;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  allocator<char> *__a;
  undefined6 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc06;
  undefined1 in_stack_fffffffffffffc07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc11;
  undefined1 in_stack_fffffffffffffc12;
  undefined1 in_stack_fffffffffffffc13;
  undefined2 in_stack_fffffffffffffc14;
  uint16_t in_stack_fffffffffffffc16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc24;
  string *in_stack_fffffffffffffc28;
  ArgsManager *in_stack_fffffffffffffc30;
  ConstevalFormatString<1U> in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  char *in_stack_fffffffffffffc78;
  char *in_stack_fffffffffffffc80;
  char *in_stack_fffffffffffffc88;
  undefined1 local_302 [65];
  undefined1 local_2c1;
  Level in_stack_fffffffffffffd60;
  allocator<char> local_299 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  undefined1 local_1f0 [56];
  _Base_ptr local_1b8;
  Proxy local_120 [3];
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
  if (*(int *)&(in_RDX->proxy).super_CNetAddr.m_addr._union == 0xfa) {
    local_1b8 = (_Base_ptr)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffbc0);
    local_1f0._48_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffbc0);
    in_RDX = in_stack_fffffffffffffbc8;
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_RDX,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffbc0), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_fffffffffffffbef,
                               CONCAT16(in_stack_fffffffffffffbee,
                                        CONCAT15(in_stack_fffffffffffffbed,in_stack_fffffffffffffbe8
                                                ))),(size_type)in_stack_fffffffffffffbe0,
                      CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                      (char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      if (iVar4 == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbe0,
                   CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                   CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
        str._M_str._0_4_ = in_stack_fffffffffffffbf8;
        str._M_len = (size_t)in_stack_fffffffffffffbf0;
        str._M_str._4_4_ = in_stack_fffffffffffffbfc;
        util::SplitString_abi_cxx11_(str,in_stack_fffffffffffffbd7);
        local_1f0._16_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffbc0);
        local_1f0._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffbc0);
        while (bVar1 = __gnu_cxx::
                       operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_RDX,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffffbc0), ((bVar1 ^ 0xffU) & 1) != 0) {
          this_00 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
          bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
          if (!bVar1) {
            pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_RDX,(size_type)in_stack_fffffffffffffbc0);
            if (*pvVar5 == '\"') {
LAB_0140cc27:
              sVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
              bVar1 = false;
              if (1 < sVar6) {
                in_stack_fffffffffffffc30 = (ArgsManager *)local_1f0;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                rbegin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
                pcVar7 = std::
                         reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)in_stack_fffffffffffffbc0);
                in_stack_fffffffffffffc24 = (int)*pcVar7;
                in_stack_fffffffffffffc28 =
                     (string *)
                     std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_RDX,(size_type)in_stack_fffffffffffffbc0);
                bVar1 = in_stack_fffffffffffffc24 ==
                        *(char *)&(in_stack_fffffffffffffc28->_M_dataplus)._M_p;
              }
            }
            else {
              pvVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_RDX,(size_type)in_stack_fffffffffffffbc0);
              bVar1 = false;
              if (*pvVar5 == '\'') goto LAB_0140cc27;
            }
            if (bVar1) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffbe0,
                     CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                     CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT26(in_stack_fffffffffffffc16,
                                          CONCAT24(in_stack_fffffffffffffc14,
                                                   CONCAT13(in_stack_fffffffffffffc13,
                                                            CONCAT12(in_stack_fffffffffffffc12,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffc11,
                                                  in_stack_fffffffffffffc10))))));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
              bVar1 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
              in_stack_fffffffffffffc18 = this_00;
              if (bVar1) goto LAB_0140cd9d;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffbc0);
            iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffbef,
                                       CONCAT16(in_stack_fffffffffffffbee,
                                                CONCAT15(in_stack_fffffffffffffbed,
                                                         in_stack_fffffffffffffbe8))),
                              (size_type)in_stack_fffffffffffffbe0,
                              CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                              (char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8))
            ;
            in_stack_fffffffffffffc14 = (undefined2)iVar4;
            in_stack_fffffffffffffc16 = (uint16_t)((uint)iVar4 >> 0x10);
            if (iVar4 == 0) break;
          }
LAB_0140cd9d:
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_RDX);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                 (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                 (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
      in_stack_fffffffffffffbc0 = "tor: Get SOCKS port command returned nothing\n";
      in_stack_fffffffffffffbb8 = 2;
      logging_function_00._M_str = in_stack_fffffffffffffc88;
      logging_function_00._M_len = (size_t)in_stack_fffffffffffffc80;
      source_file_00._M_len._7_1_ = in_stack_fffffffffffffc77;
      source_file_00._M_len._0_7_ = in_stack_fffffffffffffc70;
      source_file_00._M_str = in_stack_fffffffffffffc78;
      LogPrintFormatInternal<>
                (logging_function_00,source_file_00,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 in_stack_fffffffffffffd60,(ConstevalFormatString<0U>)in_stack_fffffffffffffc68.fmt)
      ;
    }
    else {
      bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                                  Trace);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                   (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                   (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
        in_RDX = (Proxy *)&stack0xffffffffffffffd8;
        in_stack_fffffffffffffbc0 = "Get SOCKS port command yielded %s\n";
        in_stack_fffffffffffffbb8 = 1;
        logging_function._M_str = in_stack_fffffffffffffc88;
        logging_function._M_len = (size_t)in_stack_fffffffffffffc80;
        source_file._M_len._7_1_ = in_stack_fffffffffffffc77;
        source_file._M_len._0_7_ = in_stack_fffffffffffffc70;
        source_file._M_str = in_stack_fffffffffffffc78;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function,source_file,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                   CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                   in_stack_fffffffffffffd60,in_stack_fffffffffffffc68,in_stack_fffffffffffffd70);
      }
    }
  }
  else if (*(int *)&(in_RDX->proxy).super_CNetAddr.m_addr._union == 0x1fe) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    in_stack_fffffffffffffc88 =
         "tor: Get SOCKS port command failed with unrecognized command (You probably should upgrade Tor)\n"
    ;
    in_stack_fffffffffffffbc0 =
         "tor: Get SOCKS port command failed with unrecognized command (You probably should upgrade Tor)\n"
    ;
    in_stack_fffffffffffffbb8 = 2;
    logging_function_01._M_str =
         "tor: Get SOCKS port command failed with unrecognized command (You probably should upgrade Tor)\n"
    ;
    logging_function_01._M_len = (size_t)in_stack_fffffffffffffc80;
    source_file_01._M_len._7_1_ = in_stack_fffffffffffffc77;
    source_file_01._M_len._0_7_ = in_stack_fffffffffffffc70;
    source_file_01._M_str = in_stack_fffffffffffffc78;
    LogPrintFormatInternal<>
              (logging_function_01,source_file_01,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
               CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               in_stack_fffffffffffffd60,(ConstevalFormatString<0U>)in_stack_fffffffffffffc68.fmt);
    in_RDX = in_stack_fffffffffffffbc8;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    in_stack_fffffffffffffc80 = "tor: Get SOCKS port command failed; error code %d\n";
    in_stack_fffffffffffffbc0 = "tor: Get SOCKS port command failed; error code %d\n";
    in_stack_fffffffffffffbb8 = 2;
    logging_function_02._M_str = in_stack_fffffffffffffc88;
    logging_function_02._M_len = (size_t)"tor: Get SOCKS port command failed; error code %d\n";
    source_file_02._M_len._7_1_ = in_stack_fffffffffffffc77;
    source_file_02._M_len._0_7_ = in_stack_fffffffffffffc70;
    source_file_02._M_str = in_stack_fffffffffffffc78;
    LogPrintFormatInternal<int>
              (logging_function_02,source_file_02,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
               CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               in_stack_fffffffffffffd60,in_stack_fffffffffffffc68,(int *)in_stack_fffffffffffffd70)
    ;
  }
  CService::CService((CService *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  CNetAddr::IsValid((CNetAddr *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
  inline_assertion_check<false,bool>
            ((bool *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
             (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
             (int)((ulong)in_RDX >> 0x20),in_stack_fffffffffffffbc0,
             (char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  if (!bVar1) {
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    LookupNumeric(in_stack_fffffffffffffc18,in_stack_fffffffffffffc16,
                  (DNSLookupFn *)in_stack_fffffffffffffc08);
    CService::operator=(&in_RDX->proxy,(CService *)in_stack_fffffffffffffbc0);
    CService::~CService((CService *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                 *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  }
  bVar1 = CNetAddr::IsValid((CNetAddr *)
                            CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
  if (!bVar1) {
    in_stack_fffffffffffffc08 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_299;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc08,
               (char *)CONCAT17(in_stack_fffffffffffffc07,
                                CONCAT16(in_stack_fffffffffffffc06,in_stack_fffffffffffffc00)),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    LookupNumeric(in_stack_fffffffffffffc18,in_stack_fffffffffffffc16,
                  (DNSLookupFn *)in_stack_fffffffffffffc08);
    CService::operator=(&in_RDX->proxy,(CService *)in_stack_fffffffffffffbc0);
    CService::~CService((CService *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                 *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    std::allocator<char>::~allocator(local_299);
  }
  uVar2 = CNetAddr::IsValid((CNetAddr *)
                            CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
  local_2c1 = uVar2;
  inline_assertion_check<false,bool>
            ((bool *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
             (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
             (int)((ulong)in_RDX >> 0x20),in_stack_fffffffffffffbc0,
             (char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  uVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),Trace);
  if ((bool)uVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    in_stack_fffffffffffffbc0 = "Configuring onion proxy for %s\n";
    CService::ToStringAddrPort_abi_cxx11_(in_stack_fffffffffffffbf0);
    in_RDX = local_120;
    in_stack_fffffffffffffbb8 = 1;
    logging_function_03._M_str = in_stack_fffffffffffffc88;
    logging_function_03._M_len = (size_t)in_stack_fffffffffffffc80;
    source_file_03._M_len._7_1_ = in_stack_fffffffffffffc77;
    source_file_03._M_len._0_7_ = in_stack_fffffffffffffc70;
    source_file_03._M_str = in_stack_fffffffffffffbc0;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_03,source_file_03,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
               CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               in_stack_fffffffffffffd60,in_stack_fffffffffffffc68,in_stack_fffffffffffffd70);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  }
  Proxy::Proxy(in_RDX,(CService *)in_stack_fffffffffffffbc0,
               SUB41((uint)in_stack_fffffffffffffbbc >> 0x18,0));
  SetProxy(in_stack_fffffffffffffbd8,
           (Proxy *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
  __a = (allocator<char> *)(local_302 + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc08,
             (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffc00)),__a);
  ArgsManager::GetArgs(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  std::allocator<char>::~allocator((allocator<char> *)(local_302 + 1));
  this_01 = (ReachableNets *)local_302;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc08,
             (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffc00)),__a);
  bVar1 = ArgsManager::IsArgSet
                    (in_stack_fffffffffffffbe0,
                     (string *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  bVar10 = true;
  if (bVar1) {
    cVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffbc0);
    cVar9 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffbc0);
    bVar10 = std::
             any_of<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,TorController::get_socks_cb(TorControlConnection&,TorControlReply_const&)::__0>
                       (cVar8._M_current,cVar9._M_current);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  std::allocator<char>::~allocator((allocator<char> *)local_302);
  if ((bVar10 & 1) != 0) {
    ReachableNets::Add(this_01,(Network)((ulong)__a >> 0x20));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDX);
  Proxy::~Proxy((Proxy *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  CService::~CService((CService *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TorController::get_socks_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    // NOTE: We can only get here if -onion is unset
    std::string socks_location;
    if (reply.code == 250) {
        for (const auto& line : reply.lines) {
            if (0 == line.compare(0, 20, "net/listeners/socks=")) {
                const std::string port_list_str = line.substr(20);
                std::vector<std::string> port_list = SplitString(port_list_str, ' ');

                for (auto& portstr : port_list) {
                    if (portstr.empty()) continue;
                    if ((portstr[0] == '"' || portstr[0] == '\'') && portstr.size() >= 2 && (*portstr.rbegin() == portstr[0])) {
                        portstr = portstr.substr(1, portstr.size() - 2);
                        if (portstr.empty()) continue;
                    }
                    socks_location = portstr;
                    if (0 == portstr.compare(0, 10, "127.0.0.1:")) {
                        // Prefer localhost - ignore other ports
                        break;
                    }
                }
            }
        }
        if (!socks_location.empty()) {
            LogDebug(BCLog::TOR, "Get SOCKS port command yielded %s\n", socks_location);
        } else {
            LogPrintf("tor: Get SOCKS port command returned nothing\n");
        }
    } else if (reply.code == 510) {  // 510 Unrecognized command
        LogPrintf("tor: Get SOCKS port command failed with unrecognized command (You probably should upgrade Tor)\n");
    } else {
        LogPrintf("tor: Get SOCKS port command failed; error code %d\n", reply.code);
    }

    CService resolved;
    Assume(!resolved.IsValid());
    if (!socks_location.empty()) {
        resolved = LookupNumeric(socks_location, DEFAULT_TOR_SOCKS_PORT);
    }
    if (!resolved.IsValid()) {
        // Fallback to old behaviour
        resolved = LookupNumeric("127.0.0.1", DEFAULT_TOR_SOCKS_PORT);
    }

    Assume(resolved.IsValid());
    LogDebug(BCLog::TOR, "Configuring onion proxy for %s\n", resolved.ToStringAddrPort());
    Proxy addrOnion = Proxy(resolved, true);
    SetProxy(NET_ONION, addrOnion);

    const auto onlynets = gArgs.GetArgs("-onlynet");

    const bool onion_allowed_by_onlynet{
        !gArgs.IsArgSet("-onlynet") ||
        std::any_of(onlynets.begin(), onlynets.end(), [](const auto& n) {
            return ParseNetwork(n) == NET_ONION;
        })};

    if (onion_allowed_by_onlynet) {
        // If NET_ONION is reachable, then the below is a noop.
        //
        // If NET_ONION is not reachable, then none of -proxy or -onion was given.
        // Since we are here, then -torcontrol and -torpassword were given.
        g_reachable_nets.Add(NET_ONION);
    }
}